

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O0

int raptor_sockaddr_to_string(char **out,raptor_resolved_address *resolved_addr,int normalize)

{
  undefined4 uVar1;
  uint16_t uVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  pointer pcVar6;
  char *local_120;
  char *host_with_scope;
  UniquePtr<char> tmp_out;
  raptor_sockaddr_in6 *addr6;
  raptor_sockaddr_in *addr4;
  uint local_f8;
  int ret;
  uint32_t sin6_scope_id;
  int port;
  void *ip;
  char ntop_buf [46];
  undefined1 local_b0 [8];
  raptor_resolved_address addr_normalized;
  int save_errno;
  raptor_sockaddr *addr;
  __uniq_ptr_impl<char,_raptor::DefaultDeleteChar> _Stack_18;
  int normalize_local;
  raptor_resolved_address *resolved_addr_local;
  char **out_local;
  
  piVar4 = __errno_location();
  addr_normalized.addr._124_4_ = *piVar4;
  _sin6_scope_id = (char *)0x0;
  ret = 0;
  local_f8 = 0;
  *out = (char *)0x0;
  _Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
  super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (tuple<char_*,_raptor::DefaultDeleteChar>)
       (tuple<char_*,_raptor::DefaultDeleteChar>)resolved_addr;
  if ((normalize != 0) &&
     (iVar3 = raptor_sockaddr_is_v4mapped(resolved_addr,(raptor_resolved_address *)local_b0),
     iVar3 != 0)) {
    _Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (tuple<char_*,_raptor::DefaultDeleteChar>)local_b0;
  }
  stack0xffffffffffffffd8 =
       (char *)_Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
               super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (*(ushort *)
       _Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
       super__Head_base<0UL,_char_*,_false>._M_head_impl == 2) {
    _sin6_scope_id =
         (char *)((long)_Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                        super__Head_base<0UL,_char_*,_false>._M_head_impl + 4);
    uVar2 = ntohs(*(uint16_t *)
                   ((long)_Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl + 2));
    ret = (int)uVar2;
  }
  else if (*(ushort *)
            _Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl == 10) {
    tmp_out._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>._M_t.
    super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.super__Head_base<0UL,_char_*,_false>.
    _M_head_impl = (__uniq_ptr_data<char,_raptor::DefaultDeleteChar,_true,_true>)
                   (__uniq_ptr_data<char,_raptor::DefaultDeleteChar,_true,_true>)
                   _Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl;
    _sin6_scope_id =
         (char *)((long)_Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                        super__Head_base<0UL,_char_*,_false>._M_head_impl + 8);
    uVar2 = ntohs(*(uint16_t *)
                   ((long)_Stack_18._M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                          super__Head_base<0UL,_char_*,_false>._M_head_impl + 2));
    ret = (int)uVar2;
    local_f8 = *(uint *)((long)tmp_out._M_t.super___uniq_ptr_impl<char,_raptor::DefaultDeleteChar>.
                               _M_t.super__Tuple_impl<0UL,_char_*,_raptor::DefaultDeleteChar>.
                               super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18);
  }
  if ((_sin6_scope_id == (char *)0x0) ||
     (pcVar5 = raptor_inet_ntop((uint)*(ushort *)stack0xffffffffffffffd8,_sin6_scope_id,(char *)&ip,
                                0x2e), pcVar5 == (char *)0x0)) {
    addr4._4_4_ = raptor_asprintf(out,"(sockaddr family=%d)",
                                  (ulong)*(ushort *)stack0xffffffffffffffd8);
  }
  else {
    std::unique_ptr<char,raptor::DefaultDeleteChar>::unique_ptr<raptor::DefaultDeleteChar,void>
              ((unique_ptr<char,raptor::DefaultDeleteChar> *)&host_with_scope);
    if (local_f8 == 0) {
      addr4._4_4_ = raptor::JoinHostPort((UniquePtr<char> *)&host_with_scope,(char *)&ip,ret);
    }
    else {
      raptor_asprintf(&local_120,"%s%%25%u",&ip,(ulong)local_f8);
      addr4._4_4_ = raptor::JoinHostPort((UniquePtr<char> *)&host_with_scope,local_120,ret);
      raptor::Free(local_120);
    }
    pcVar6 = std::unique_ptr<char,_raptor::DefaultDeleteChar>::release
                       ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&host_with_scope);
    *out = pcVar6;
    std::unique_ptr<char,_raptor::DefaultDeleteChar>::~unique_ptr
              ((unique_ptr<char,_raptor::DefaultDeleteChar> *)&host_with_scope);
  }
  uVar1 = addr_normalized.addr._124_4_;
  piVar4 = __errno_location();
  *piVar4 = uVar1;
  return addr4._4_4_;
}

Assistant:

int raptor_sockaddr_to_string(char** out,
                              const raptor_resolved_address* resolved_addr,
                              int normalize) {
    const raptor_sockaddr* addr;
    const int save_errno = errno;
    raptor_resolved_address addr_normalized;
    char ntop_buf[INET6_ADDRSTRLEN];
    const void* ip = nullptr;
    int port = 0;
    uint32_t sin6_scope_id = 0;
    int ret;

    *out = nullptr;
    if (normalize && raptor_sockaddr_is_v4mapped(resolved_addr, &addr_normalized)) {
        resolved_addr = &addr_normalized;
    }
    addr = reinterpret_cast<const raptor_sockaddr*>(resolved_addr->addr);
    if (addr->sa_family == AF_INET) {
        const raptor_sockaddr_in* addr4 =
            reinterpret_cast<const raptor_sockaddr_in*>(addr);
        ip = &addr4->sin_addr;
        port = ntohs(addr4->sin_port);
    } else if (addr->sa_family == AF_INET6) {
        const raptor_sockaddr_in6* addr6 =
            reinterpret_cast<const raptor_sockaddr_in6*>(addr);
        ip = &addr6->sin6_addr;
        port = ntohs(addr6->sin6_port);
        sin6_scope_id = addr6->sin6_scope_id;
    }
    if (ip != nullptr && raptor_inet_ntop(addr->sa_family, ip, ntop_buf,
                                        sizeof(ntop_buf)) != nullptr) {
        raptor::UniquePtr<char> tmp_out;
        if (sin6_scope_id != 0) {
            char* host_with_scope;
            /* Enclose sin6_scope_id with the format defined in RFC 6784 section 2. */
            raptor_asprintf(&host_with_scope, "%s%%25%u", ntop_buf, sin6_scope_id);
            ret = raptor::JoinHostPort(&tmp_out, host_with_scope, port);
            raptor::Free(host_with_scope);
        } else {
            ret = raptor::JoinHostPort(&tmp_out, ntop_buf, port);
        }
        *out = tmp_out.release();
    } else {
        ret = raptor_asprintf(out, "(sockaddr family=%d)", addr->sa_family);
    }
    /* This is probably redundant, but we wouldn't want to log the wrong error. */
    errno = save_errno;
    return ret;
}